

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

RESET_DATA * new_reset_data(void)

{
  RESET_DATA *pRVar1;
  uint clearmem;
  long lVar2;
  
  if (reset_free == (RESET_DATA *)0x0) {
    pRVar1 = (RESET_DATA *)operator_new(0x18);
    for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 1) {
      *(undefined1 *)((long)&pRVar1->next + lVar2) = 0;
    }
    top_reset = top_reset + 1;
  }
  else {
    pRVar1 = reset_free;
    reset_free = reset_free->next;
  }
  pRVar1->next = (RESET_DATA *)0x0;
  pRVar1->command = 'X';
  pRVar1->arg1 = 0;
  pRVar1->arg2 = 0;
  pRVar1->arg3 = 0;
  return pRVar1;
}

Assistant:

RESET_DATA *new_reset_data(void)
{
	RESET_DATA *pReset;

	if (!reset_free)
	{
		pReset = new RESET_DATA;
		CLEAR_MEM(pReset, sizeof(RESET_DATA))
		top_reset++;
	}
	else
	{
		pReset = reset_free;
		reset_free = reset_free->next;
	}

	pReset->next = nullptr;
	pReset->command = 'X';
	pReset->arg1 = 0;
	pReset->arg2 = 0;
	pReset->arg3 = 0;

	return pReset;
}